

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

void __thiscall ON_MeshNgonIterator::ON_MeshNgonIterator(ON_MeshNgonIterator *this,ON_Mesh *mesh)

{
  uint *meshfdex_to_meshngondex_map;
  
  this->m_mesh = (ON_Mesh *)0x0;
  this->m_facedex_to_ngondex_map = (uint *)0x0;
  this->m_current_ngon = 0;
  ON_MeshNgonBuffer::ON_MeshNgonBuffer(&this->m_ngon_buffer);
  this->m_current_ngon_ci = ON_COMPONENT_INDEX::UnsetComponentIndex;
  this->m_mesh_face_count = 0;
  this->m_mesh_ngon_count = 0;
  this->m_iterator_index = 0;
  if (mesh != (ON_Mesh *)0x0) {
    if (((mesh->m_Ngon).m_count == 0) || ((mesh->m_F).m_count != (mesh->m_NgonMap).m_count)) {
      meshfdex_to_meshngondex_map = (uint *)0x0;
    }
    else {
      meshfdex_to_meshngondex_map = (mesh->m_NgonMap).m_a;
    }
    SetMesh(this,mesh,meshfdex_to_meshngondex_map);
    return;
  }
  return;
}

Assistant:

ON_MeshNgonIterator::ON_MeshNgonIterator(
  const class ON_Mesh* mesh
  )
{
  if ( 0 != mesh )
    SetMesh(mesh,mesh->NgonMap());
}